

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptFunction::GetDiagValueString
          (JavascriptFunction *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  byte bVar1;
  Type TVar2;
  ScriptContext *pSVar3;
  code *pcVar4;
  LPCUTF8 this_00;
  bool bVar5;
  int iVar6;
  int32 propertyId;
  charcount_t cVar7;
  undefined4 extraout_var;
  PropertyString *name;
  JavascriptString *this_01;
  FunctionProxy *this_02;
  ParseableFunctionInfo *this_03;
  LPCUTF8 puVar8;
  PrintOffsets *pPVar9;
  size_t sVar10;
  undefined4 *puVar11;
  char16 *pcVar12;
  Type TVar13;
  Type countNeeded;
  charcount_t local_44;
  LPCUTF8 puStack_40;
  charcount_t displayNameLength;
  LPCUTF8 pbStart;
  Var aValue;
  
  iVar6 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])();
  aValue = (Var)CONCAT44(extraout_var,iVar6);
  if (aValue == (Var)0x0) {
    this_02 = GetFunctionProxy(this);
    if (this_02 == (FunctionProxy *)0x0) {
      this_01 = StringCache::GetFunctionDisplay
                          (&((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                             javascriptLibrary).ptr)->stringCache);
    }
    else {
      this_03 = FunctionProxy::EnsureDeserialized(this_02);
      bVar1 = ((this_03->super_FunctionProxy).m_utf8SourceInfo.ptr)->field_0xa8;
      if ((bVar1 & 4) == 0) {
        countNeeded = this_03->m_cchLength;
        pbStart = (LPCUTF8)stringBuilder;
        puVar8 = ParseableFunctionInfo::GetToStringSource
                           (this_03,L"JavascriptFunction::GetDiagValueString");
        TVar2 = this_03->m_cbLength;
        puStack_40 = puVar8;
        pPVar9 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)28,Js::PrintOffsets*>
                           (&this_03->super_FunctionProxy);
        this_00 = pbStart;
        TVar13 = TVar2;
        if (pPVar9 != (PrintOffsets *)0x0) {
          TVar13 = pPVar9->cbEndPrintOffset - pPVar9->cbStartPrintOffset;
          countNeeded = countNeeded + (TVar13 - TVar2) * 3;
        }
        pcVar12 = StringBuilder<Memory::ArenaAllocator>::AllocBufferSpace
                            ((StringBuilder<Memory::ArenaAllocator> *)pbStart,countNeeded);
        sVar10 = utf8::DecodeUnitsInto
                           (pcVar12,&stack0xffffffffffffffc0,puVar8 + TVar13,
                            bVar1 >> 1 & doAllowThreeByteSurrogates,(bool *)0x0);
        if (0x7ffffffd < sVar10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                      ,0xc61,"(decodedCount < MaxCharCount)",
                                      "decodedCount < MaxCharCount");
          if (!bVar5) goto LAB_00a8be9d;
          *puVar11 = 0;
        }
        cVar7 = 0x100;
        if ((uint)sVar10 < 0x100) {
          cVar7 = (uint)sVar10;
        }
        StringBuilder<Memory::ArenaAllocator>::IncreaseCount
                  ((StringBuilder<Memory::ArenaAllocator> *)this_00,cVar7);
        return 1;
      }
      local_44 = 0;
      pSVar3 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      pcVar12 = FunctionProxy::GetShortDisplayName(&this_03->super_FunctionProxy,&local_44);
      this_01 = GetLibraryCodeDisplayStringCommon<Js::JavascriptString,Js::JavascriptString*,Js::ScriptContext>
                          (pSVar3,pcVar12);
    }
  }
  else {
    bVar5 = TaggedInt::Is(aValue);
    if (bVar5) {
      pSVar3 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      propertyId = TaggedInt::ToInt32(aValue);
      name = ScriptContext::GetPropertyString(pSVar3,propertyId);
      this_01 = GetNativeFunctionDisplayStringCommon<Js::JavascriptString,Js::JavascriptString*,Js::ScriptContext>
                          (pSVar3,&name->super_JavascriptString);
    }
    else {
      bVar5 = VarIs<Js::JavascriptString>(aValue);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                    ,0xc73,"(VarIs<JavascriptString>(sourceString))",
                                    "VarIs<JavascriptString>(sourceString)");
        if (!bVar5) goto LAB_00a8be9d;
        *puVar11 = 0;
      }
      this_01 = VarTo<Js::JavascriptString>(aValue);
    }
  }
  if (this_01 == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xc78,"(pString)","pString");
    if (!bVar5) {
LAB_00a8be9d:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
  }
  pcVar12 = JavascriptString::GetString(this_01);
  cVar7 = JavascriptString::GetLength(this_01);
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,pcVar12,cVar7);
  return 1;
}

Assistant:

BOOL JavascriptFunction::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        JavascriptString * pString = NULL;

        Var sourceString = this->GetSourceString();

        if (sourceString == nullptr)
        {
            FunctionProxy* proxy = this->GetFunctionProxy();
            if (proxy)
            {
                ParseableFunctionInfo * func = proxy->EnsureDeserialized();
                Utf8SourceInfo* sourceInfo = func->GetUtf8SourceInfo();
                if (sourceInfo->GetIsLibraryCode())
                {
                    charcount_t displayNameLength = 0;
                    pString = JavascriptFunction::GetLibraryCodeDisplayString(this->GetScriptContext(), func->GetShortDisplayName(&displayNameLength));
                }
                else
                {
                    utf8::DecodeOptions options = sourceInfo->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
                    charcount_t count = func->LengthInChars();
                    LPCUTF8 pbStart = func->GetToStringSource(_u("JavascriptFunction::GetDiagValueString"));
                    size_t cbLength = func->LengthInBytes();
                    PrintOffsets* printOffsets = func->GetPrintOffsets();
                    if (printOffsets != nullptr)
                    {
                        count += 3*(charcount_t)((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) - cbLength);
                        cbLength = printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset;
                    }

                    size_t decodedCount = utf8::DecodeUnitsInto(stringBuilder->AllocBufferSpace(count), pbStart, pbStart + cbLength, options);
                    Assert(decodedCount < MaxCharCount);
                    stringBuilder->IncreaseCount(min(DIAG_MAX_FUNCTION_STRING, (charcount_t)decodedCount));
                    return TRUE;
                }
            }
            else
            {
                pString = GetLibrary()->GetFunctionDisplayString();
            }
        }
        else
        {
            if (TaggedInt::Is(sourceString))
            {
                pString = GetNativeFunctionDisplayString(this->GetScriptContext(), this->GetScriptContext()->GetPropertyString(TaggedInt::ToInt32(sourceString)));
            }
            else
            {
                Assert(VarIs<JavascriptString>(sourceString));
                pString = VarTo<JavascriptString>(sourceString);
            }
        }

        Assert(pString);
        stringBuilder->Append(pString->GetString(), pString->GetLength());

        return TRUE;
    }